

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O1

int Curl_llist_insert_next(curl_llist *list,curl_llist_element *e,void *p)

{
  size_t sVar1;
  curl_llist_element *pcVar2;
  curl_llist_element **ppcVar3;
  curl_llist *pcVar4;
  
  pcVar2 = (curl_llist_element *)(*Curl_cmalloc)(0x18);
  if (pcVar2 == (curl_llist_element *)0x0) {
    return 0;
  }
  pcVar2->ptr = p;
  sVar1 = list->size;
  if (sVar1 == 0) {
    list->head = pcVar2;
    ppcVar3 = &list->tail;
    pcVar2->prev = (curl_llist_element *)0x0;
    pcVar2->next = (curl_llist_element *)0x0;
  }
  else {
    ppcVar3 = &e->next;
    pcVar4 = (curl_llist *)ppcVar3;
    if (e == (curl_llist_element *)0x0) {
      pcVar4 = list;
    }
    pcVar2->next = pcVar4->head;
    pcVar2->prev = e;
    if (e == (curl_llist_element *)0x0) {
      list->head->prev = pcVar2;
      pcVar4 = list;
    }
    else if (*ppcVar3 == (curl_llist_element *)0x0) {
      pcVar4 = (curl_llist *)&list->tail;
    }
    else {
      pcVar4 = (curl_llist *)&(*ppcVar3)->prev;
    }
    pcVar4->head = pcVar2;
    if (e == (curl_llist_element *)0x0) goto LAB_004c5dd4;
  }
  *ppcVar3 = pcVar2;
LAB_004c5dd4:
  list->size = sVar1 + 1;
  return 1;
}

Assistant:

int
Curl_llist_insert_next(struct curl_llist *list, struct curl_llist_element *e,
                       const void *p)
{
  struct curl_llist_element *ne = malloc(sizeof(struct curl_llist_element));
  if(!ne)
    return 0;

  ne->ptr = (void *) p;
  if(list->size == 0) {
    list->head = ne;
    list->head->prev = NULL;
    list->head->next = NULL;
    list->tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->next = e?e->next:list->head;
    ne->prev = e;
    if(!e) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if(e->next) {
      e->next->prev = ne;
    }
    else {
      list->tail = ne;
    }
    if(e)
      e->next = ne;
  }

  ++list->size;

  return 1;
}